

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cpp
# Opt level: O3

void duckdb_brotli::BrotliBuildMetaBlockGreedy
               (MemoryManager *m,uint8_t *ringbuffer,size_t pos,size_t mask,uint8_t prev_byte,
               uint8_t prev_byte2,ContextLut literal_context_lut,size_t num_contexts,
               uint32_t *static_context_map,Command *commands,size_t n_commands,MetaBlockSplit *mb)

{
  ulong uVar1;
  BlockSplitterCommand *pBVar2;
  int *piVar3;
  long *plVar4;
  byte bVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  size_t __n;
  undefined1 auVar11 [16];
  BlockSplitterLiteral *self;
  size_t sVar12;
  double dVar13;
  ulong uVar14;
  uint8_t *__dest;
  uint32_t *puVar15;
  HistogramLiteral *__s;
  Command *pCVar16;
  ulong uVar17;
  size_t sVar18;
  long lVar19;
  MemoryManager *m_00;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  BlockSplitterLiteral *pBVar23;
  BlockSplitterDistance *pBVar24;
  MemoryManager *histograms_size;
  
  uVar21 = (ulong)prev_byte2;
  uVar22 = (ulong)prev_byte;
  self = (BlockSplitterLiteral *)BrotliAllocate(m,0x30c8);
  if (num_contexts == 1) {
    sVar18 = 0;
    sVar12 = n_commands;
    pCVar16 = commands;
    if (n_commands != 0) {
      do {
        sVar18 = sVar18 + pCVar16->insert_len_;
        sVar12 = sVar12 - 1;
        pCVar16 = pCVar16 + 1;
      } while (sVar12 != 0);
    }
    pBVar23 = self;
    m_00 = m;
    InitBlockSplitterLiteral
              (m,self,sVar18,(size_t)mb,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),
               (size_t)&mb->literal_histograms,(BlockSplit *)&mb->literal_histograms_size,
               (HistogramLiteral **)self,(size_t *)m);
    pBVar2 = (BlockSplitterCommand *)(pBVar23 + 1);
    InitBlockSplitterCommand
              (m,pBVar2,n_commands,(size_t)&mb->command_split,
               (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00),
               (size_t)&mb->command_histograms,(BlockSplit *)&mb->command_histograms_size,
               (HistogramCommand **)pBVar23,(size_t *)m_00);
    pBVar24 = (BlockSplitterDistance *)(pBVar23[3].combined_histo[1].data_ + 0x48);
    InitBlockSplitterDistance
              (m,pBVar24,n_commands,(size_t)&mb->distance_split,
               (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01),
               (size_t)&mb->distance_histograms,(BlockSplit *)&mb->distance_histograms_size,
               (HistogramDistance **)pBVar24,(size_t *)m_00);
    if (n_commands != 0) {
      sVar12 = 0;
      do {
        uVar8 = commands[sVar12].insert_len_;
        uVar9 = commands[sVar12].copy_len_;
        uVar6 = commands[sVar12].dist_prefix_;
        uVar7 = commands[sVar12].cmd_prefix_;
        BlockSplitterAddSymbolCommand(pBVar2,(ulong)uVar7);
        for (uVar22 = (ulong)uVar8; uVar22 != 0; uVar22 = uVar22 - 1) {
          BlockSplitterAddSymbolLiteral(self,(ulong)ringbuffer[pos & mask]);
          pos = pos + 1;
        }
        if (((uVar9 & 0x1ffffff) != 0) && (0x7f < uVar7)) {
          BlockSplitterAddSymbolDistance(pBVar24,(ulong)(uVar6 & 0x3ff));
        }
        pos = pos + (uVar9 & 0x1ffffff);
        sVar12 = sVar12 + 1;
      } while (sVar12 != n_commands);
    }
    BlockSplitterFinishBlockLiteral(self,1);
    BlockSplitterFinishBlockCommand(pBVar2,1);
    BlockSplitterFinishBlockDistance(pBVar24,1);
  }
  else {
    uVar20 = 0;
    pCVar16 = commands;
    sVar12 = n_commands;
    if (n_commands != 0) {
      do {
        uVar20 = uVar20 + pCVar16->insert_len_;
        sVar12 = sVar12 - 1;
        pCVar16 = pCVar16 + 1;
      } while (sVar12 != 0);
      uVar20 = uVar20 >> 9;
    }
    uVar1 = uVar20 + 1;
    self->alphabet_size_ = 0x100;
    self->min_block_size_ = num_contexts;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = num_contexts;
    dVar13 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x100)) / auVar11,0);
    self->split_threshold_ = dVar13;
    self->num_blocks_ = 0x200;
    self->split_ = (BlockSplit *)0x4079000000000000;
    self->histograms_ = (HistogramLiteral *)0x0;
    self->histograms_size_ = (size_t *)mb;
    *(size_t **)(self->combined_histo[0].data_ + 2) = &mb->literal_histograms_size;
    self->combined_histo[0].data_[4] = 0x200;
    self->combined_histo[0].data_[5] = 0;
    self->combined_histo[0].data_[0x42] = 0;
    self->combined_histo[0].data_[0x43] = 0;
    uVar14 = (long)dVar13 + 1;
    if (uVar1 < uVar14) {
      uVar14 = uVar1;
    }
    self->combined_histo[0].data_[6] = 0;
    self->combined_histo[0].data_[7] = 0;
    self->combined_histo[0].data_[8] = 0;
    self->combined_histo[0].data_[9] = 0;
    uVar10 = (mb->literal_split).types_alloc_size;
    pBVar23 = self;
    if (uVar10 <= uVar20) {
      if (uVar10 == 0) {
        uVar10 = uVar1;
      }
      do {
        uVar17 = uVar10;
        uVar10 = uVar17 * 2;
      } while (uVar17 <= uVar20);
      __dest = (uint8_t *)BrotliAllocate(m,uVar17);
      __n = (mb->literal_split).types_alloc_size;
      if (__n != 0) {
        switchD_00332694::default(__dest,(mb->literal_split).types,__n);
      }
      BrotliFree(m,(mb->literal_split).types);
      (mb->literal_split).types = __dest;
      (mb->literal_split).types_alloc_size = uVar17;
    }
    uVar10 = (mb->literal_split).lengths_alloc_size;
    if (uVar10 <= uVar20) {
      if (uVar10 == 0) {
        uVar10 = uVar1;
      }
      do {
        uVar17 = uVar10;
        uVar10 = uVar17 * 2;
      } while (uVar17 <= uVar20);
      puVar15 = (uint32_t *)BrotliAllocate(m,uVar17 * 4);
      sVar12 = (mb->literal_split).lengths_alloc_size;
      if (sVar12 != 0) {
        switchD_00332694::default(puVar15,(mb->literal_split).lengths,sVar12 << 2);
      }
      BrotliFree(m,(mb->literal_split).lengths);
      (mb->literal_split).lengths = puVar15;
      (mb->literal_split).lengths_alloc_size = uVar17;
    }
    (mb->literal_split).num_blocks = uVar1;
    sVar12 = uVar14 * num_contexts;
    mb->literal_histograms_size = sVar12;
    if (sVar12 == 0) {
      __s = (HistogramLiteral *)0x0;
      m_00 = m;
    }
    else {
      __s = (HistogramLiteral *)BrotliAllocate(m,sVar12 * 0x410);
      m_00 = m;
    }
    mb->literal_histograms = __s;
    *(HistogramLiteral **)self->combined_histo[0].data_ = __s;
    lVar19 = num_contexts + (num_contexts == 0);
    do {
      memset(__s,0,0x408);
      __s->bit_cost_ = INFINITY;
      __s = __s + 1;
      lVar19 = lVar19 + -1;
    } while (lVar19 != 0);
    self->combined_histo[0].data_[10] = 0;
    self->combined_histo[0].data_[0xb] = 0;
    self->combined_histo[0].data_[0xc] = 0;
    self->combined_histo[0].data_[0xd] = 0;
    pBVar2 = (BlockSplitterCommand *)(pBVar23 + 1);
    histograms_size = m_00;
    InitBlockSplitterCommand
              (m_00,pBVar2,n_commands,(size_t)&mb->command_split,0.0,(size_t)&mb->command_histograms
               ,(BlockSplit *)&mb->command_histograms_size,(HistogramCommand **)pBVar23,
               (size_t *)m_00);
    pBVar24 = (BlockSplitterDistance *)(pBVar23[3].combined_histo[1].data_ + 0x48);
    InitBlockSplitterDistance
              (m_00,pBVar24,n_commands,(size_t)&mb->distance_split,
               (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02),
               (size_t)&mb->distance_histograms,(BlockSplit *)&mb->distance_histograms_size,
               (HistogramDistance **)pBVar24,(size_t *)histograms_size);
    if (n_commands != 0) {
      sVar12 = 0;
      do {
        uVar8 = commands[sVar12].insert_len_;
        uVar9 = commands[sVar12].copy_len_;
        uVar6 = commands[sVar12].dist_prefix_;
        uVar7 = commands[sVar12].cmd_prefix_;
        BlockSplitterAddSymbolCommand(pBVar2,(ulong)uVar7);
        uVar1 = uVar22;
        for (uVar20 = (ulong)uVar8; uVar22 = uVar1, uVar20 != 0; uVar20 = uVar20 - 1) {
          bVar5 = ringbuffer[pos & mask];
          uVar8 = static_context_map
                  [literal_context_lut[uVar21 + 0x100] | literal_context_lut[uVar22]];
          lVar19 = *(long *)(self->combined_histo[0].data_ + 8) * 0x410 +
                   *(long *)self->combined_histo[0].data_;
          piVar3 = (int *)(lVar19 + (ulong)uVar8 * 0x410 + (ulong)bVar5 * 4);
          *piVar3 = *piVar3 + 1;
          plVar4 = (long *)((ulong)uVar8 * 0x410 + 0x400 + lVar19);
          *plVar4 = *plVar4 + 1;
          lVar19 = *(long *)(self->combined_histo[0].data_ + 6) + 1;
          *(long *)(self->combined_histo[0].data_ + 6) = lVar19;
          if (lVar19 == *(long *)(self->combined_histo[0].data_ + 4)) {
            ContextBlockSplitterFinishBlock((ContextBlockSplitter *)self,m_00,0);
          }
          pos = pos + 1;
          uVar1 = (ulong)bVar5;
          uVar21 = uVar22;
        }
        uVar20 = (ulong)(uVar9 & 0x1ffffff);
        pos = pos + uVar20;
        if (uVar20 != 0) {
          uVar21 = (ulong)ringbuffer[pos - 2 & mask];
          uVar22 = (ulong)ringbuffer[pos - 1 & mask];
          if (0x7f < uVar7) {
            BlockSplitterAddSymbolDistance(pBVar24,(ulong)(uVar6 & 0x3ff));
          }
        }
        sVar12 = sVar12 + 1;
      } while (sVar12 != n_commands);
    }
    ContextBlockSplitterFinishBlock((ContextBlockSplitter *)self,m_00,1);
    BlockSplitterFinishBlockCommand(pBVar2,1);
    BlockSplitterFinishBlockDistance(pBVar24,1);
    sVar12 = (mb->literal_split).num_types;
    mb->literal_context_map_size = sVar12 << 6;
    if (sVar12 << 6 == 0) {
      puVar15 = (uint32_t *)0x0;
    }
    else {
      puVar15 = (uint32_t *)BrotliAllocate(m_00,sVar12 << 8);
      sVar12 = (mb->literal_split).num_types;
    }
    mb->literal_context_map = puVar15;
    if (sVar12 != 0) {
      sVar18 = 0;
      do {
        lVar19 = 0;
        do {
          puVar15[lVar19] = static_context_map[lVar19] + (int)sVar18 * (int)num_contexts;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0x40);
        sVar18 = sVar18 + 1;
        puVar15 = puVar15 + 0x40;
      } while (sVar18 != sVar12);
    }
  }
  BrotliFree(m_00,self);
  return;
}

Assistant:

void duckdb_brotli::BrotliBuildMetaBlockGreedy(MemoryManager* m,
                                const uint8_t* ringbuffer,
                                size_t pos,
                                size_t mask,
                                uint8_t prev_byte,
                                uint8_t prev_byte2,
                                ContextLut literal_context_lut,
                                size_t num_contexts,
                                const uint32_t* static_context_map,
                                const Command* commands,
                                size_t n_commands,
                                MetaBlockSplit* mb) {
  GreedyMetablockArena* arena = BROTLI_ALLOC(m, GreedyMetablockArena, 1);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(arena)) return;
  if (num_contexts == 1) {
    BrotliBuildMetaBlockGreedyInternal(m, arena, ringbuffer, pos, mask,
        prev_byte, prev_byte2, literal_context_lut, 1, NULL, commands,
        n_commands, mb);
  } else {
    BrotliBuildMetaBlockGreedyInternal(m, arena, ringbuffer, pos, mask,
        prev_byte, prev_byte2, literal_context_lut, num_contexts,
        static_context_map, commands, n_commands, mb);
  }
  BROTLI_FREE(m, arena);
}